

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a2.cpp
# Opt level: O0

void msd_A2_adaptive(cacheblock_t *cache,size_t N,size_t cache_depth,size_t true_depth,
                    TempSpace *tmp)

{
  value_type vVar1;
  long lVar2;
  size_t index;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  undefined4 uVar6;
  ushort uVar7;
  long *__ptr;
  reference pvVar8;
  cacheblock_t *pcVar9;
  cacheblock_t *pcVar10;
  uint local_64;
  long lStack_60;
  uint i_3;
  size_t bsum;
  ulong uStack_50;
  uint16_t bucket_1;
  size_t i_2;
  uint i_1;
  uint16_t bucket;
  size_t i;
  size_t *bucketsize;
  TempSpace *tmp_local;
  size_t true_depth_local;
  size_t cache_depth_local;
  size_t N_local;
  cacheblock_t *cache_local;
  
  if (N < 0x10000) {
    msd_A2(cache,N,cache_depth,true_depth,tmp);
  }
  else {
    true_depth_local = cache_depth;
    if (3 < cache_depth) {
      fill_cache(cache,N,true_depth);
      true_depth_local = 0;
    }
    TempSpace::allocate(tmp,N);
    __ptr = (long *)calloc(0x10000,8);
    for (_i_1 = 0; _i_1 < N; _i_1 = _i_1 + 1) {
      uVar7 = CONCAT11(cache[_i_1].bytes[true_depth_local],cache[_i_1].bytes[true_depth_local + 1]);
      __ptr[uVar7] = __ptr[uVar7] + 1;
    }
    pvVar8 = std::array<unsigned_long,_65536UL>::operator[](&msd_A2_adaptive::bucketindex,0);
    *pvVar8 = 0;
    for (i_2._0_4_ = 1; (uint)i_2 < 0x10000; i_2._0_4_ = (uint)i_2 + 1) {
      pvVar8 = std::array<unsigned_long,_65536UL>::operator[]
                         (&msd_A2_adaptive::bucketindex,(ulong)((uint)i_2 - 1));
      vVar1 = *pvVar8;
      lVar2 = __ptr[(uint)i_2 - 1];
      pvVar8 = std::array<unsigned_long,_65536UL>::operator[]
                         (&msd_A2_adaptive::bucketindex,(ulong)(uint)i_2);
      *pvVar8 = vVar1 + lVar2;
    }
    for (uStack_50 = 0; uStack_50 < N; uStack_50 = uStack_50 + 1) {
      pcVar9 = cache + uStack_50;
      pvVar8 = std::array<unsigned_long,_65536UL>::operator[]
                         (&msd_A2_adaptive::bucketindex,
                          (ulong)CONCAT11(cache[uStack_50].bytes[true_depth_local],
                                          cache[uStack_50].bytes[true_depth_local + 1]));
      index = *pvVar8;
      *pvVar8 = index + 1;
      pcVar10 = TempSpace::operator[](tmp,index);
      uVar3 = pcVar9->bytes[1];
      uVar4 = pcVar9->bytes[2];
      uVar5 = pcVar9->bytes[3];
      uVar6 = *(undefined4 *)&pcVar9->field_0x4;
      pcVar10->bytes[0] = pcVar9->bytes[0];
      pcVar10->bytes[1] = uVar3;
      pcVar10->bytes[2] = uVar4;
      pcVar10->bytes[3] = uVar5;
      *(undefined4 *)&pcVar10->field_0x4 = uVar6;
      pcVar10->ptr = pcVar9->ptr;
    }
    copy((EVP_PKEY_CTX *)tmp,(EVP_PKEY_CTX *)cache);
    TempSpace::deallocate(tmp);
    lStack_60 = *__ptr;
    for (local_64 = 1; local_64 < 0x10000; local_64 = local_64 + 1) {
      if (__ptr[local_64] != 0) {
        if ((local_64 & 0xff) != 0) {
          msd_A2_adaptive(cache + lStack_60,__ptr[local_64],true_depth_local + 2,true_depth + 2,tmp)
          ;
        }
        lStack_60 = __ptr[local_64] + lStack_60;
      }
    }
    free(__ptr);
  }
  return;
}

Assistant:

static void
msd_A2_adaptive(cacheblock_t* cache,
                size_t N,
                size_t cache_depth,
                size_t true_depth,
                TempSpace& tmp)
{
	if (N < 0x10000) {
		msd_A2(cache, N, cache_depth, true_depth, tmp);
		return;
	}
	if (cache_depth >= CACHED_BYTES) {
		fill_cache(cache, N, true_depth);
		cache_depth = 0;
	}
	tmp.allocate(N);
	size_t* bucketsize = static_cast<size_t*>(calloc(0x10000,
				sizeof(size_t)));
	for (size_t i=0; i < N; ++i) {
		uint16_t bucket =
			(cache[i].bytes[cache_depth] << 8) |
			 cache[i].bytes[cache_depth+1];
		++bucketsize[bucket];
	}
	static std::array<size_t, 0x10000> bucketindex;
	bucketindex[0] = 0;
	for (unsigned i=1; i < 0x10000; ++i)
		bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
	for (size_t i=0; i < N; ++i) {
		uint16_t bucket = (cache[i].bytes[cache_depth] << 8)
			| cache[i].bytes[cache_depth+1];
		tmp[bucketindex[bucket]++] = cache[i];
	}
	copy(tmp, cache, N);
	tmp.deallocate();
	size_t bsum = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_A2_adaptive(cache+bsum, bucketsize[i],
				cache_depth+2, true_depth+2, tmp);
		bsum += bucketsize[i];
	}
	free(bucketsize);
}